

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLEBABecLap.cpp
# Opt level: O1

void __thiscall
amrex::MLEBABecLap::setEBDirichlet(MLEBABecLap *this,int amrlev,MultiFab *phi,Real beta)

{
  undefined8 uVar1;
  Location LVar2;
  BoxArray *bxs;
  DistributionMapping *dm;
  FabFactory<amrex::FArrayBox> *pFVar3;
  pointer puVar4;
  tuple<amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_> tVar5;
  long *plVar6;
  uint ncomp;
  FabType FVar7;
  __uniq_ptr_data<amrex::MultiFab,_std::default_delete<amrex::MultiFab>,_true,_true> _Var8;
  MultiFab *this_00;
  FabArray<amrex::EBCellFlagFab> *pFVar9;
  pointer *ppbVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  uint32_t *puVar15;
  long lVar16;
  long lVar17;
  int iVar18;
  long lVar19;
  bool bVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  Periodicity PVar25;
  MFIter mfi;
  MFItInfo mfi_info;
  long local_250;
  long local_248;
  long local_218;
  Box local_1f4;
  FabArray<amrex::FArrayBox> *local_1d8;
  long local_1d0;
  MLEBABecLap *local_1c8;
  ulong local_1c0;
  undefined1 local_1b8 [16];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1a8;
  int local_190;
  Vector<int,_std::allocator<int>_> *local_178;
  Real local_158;
  FabArray<amrex::EBCellFlagFab> *local_150;
  Array4<double> local_148;
  Array4<double> local_108;
  Array4<const_double> local_c8;
  Array4<const_amrex::EBCellFlag> local_88;
  MFItInfo local_44;
  
  local_1d8 = &phi->super_FabArray<amrex::FArrayBox>;
  local_158 = beta;
  ncomp = (*(this->super_MLCellABecLap).super_MLCellLinOp.super_MLLinOp._vptr_MLLinOp[5])();
  LVar2 = this->m_phi_loc;
  lVar16 = (long)amrlev;
  if ((_Head_base<0UL,_amrex::MultiFab_*,_false>)
      *(_Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_> *)
       &(this->m_eb_phi).
        super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
        .
        super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start[lVar16]._M_t.
        super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> ==
      (MultiFab *)0x0) {
    bxs = *(BoxArray **)
           &(this->super_MLCellABecLap).super_MLCellLinOp.super_MLLinOp.m_grids.
            super_vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
            .
            super__Vector_base<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start[lVar16].
            super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
            super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>;
    dm = *(DistributionMapping **)
          &(this->super_MLCellABecLap).super_MLCellLinOp.super_MLLinOp.m_dmap.
           super_vector<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
           .
           super__Vector_base<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[lVar16].
           super_vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>.
           super__Vector_base<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
    ;
    local_1b8._1_7_ = 0;
    local_1b8[0] = true;
    local_1b8._8_4_ = 0;
    local_1b8._12_4_ = 0;
    local_1a8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1a8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1a8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pFVar3 = (FabFactory<amrex::FArrayBox> *)
             **(undefined8 **)
               &(this->super_MLCellABecLap).super_MLCellLinOp.super_MLLinOp.m_factory.
                super_vector<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
                .
                super__Vector_base<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[lVar16].
                super_vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>
                .
                super__Vector_base<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>
    ;
    _Var8.super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
    super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
    super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl =
         (__uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>)
         operator_new(0x180);
    MultiFab::MultiFab((MultiFab *)
                       _Var8.
                       super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
                       .super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,bxs,dm,ncomp,
                       (uint)(LVar2 == CellCentroid),(MFInfo *)local_1b8,pFVar3);
    puVar4 = (this->m_eb_phi).
             super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
             .
             super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    tVar5.super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
    super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl =
         *(_Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_> *)
          &puVar4[lVar16]._M_t.
           super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>;
    puVar4[lVar16]._M_t.
    super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> =
         _Var8.super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
         super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
         super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl;
    if (tVar5.super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
        super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl !=
        (_Head_base<0UL,_amrex::MultiFab_*,_false>)0x0) {
      (**(code **)(*(long *)tVar5.
                            super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
                            .super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl + 8))();
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_1a8);
  }
  lVar17 = lVar16;
  local_1d0 = lVar16;
  local_1c8 = this;
  if ((**(long **)&(this->m_eb_b_coeffs).
                   super_vector<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
                   .
                   super__Vector_base<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[lVar16].
                   super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                   .
                   super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
       == 0) &&
     (0 < (this->super_MLCellABecLap).super_MLCellLinOp.super_MLLinOp.m_num_mg_levels.
          super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>.
          _M_impl.super__Vector_impl_data._M_start[lVar16])) {
    local_250 = 0;
    lVar13 = 0;
    lVar19 = 0;
    do {
      lVar17 = *(long *)&(this->super_MLCellABecLap).super_MLCellLinOp.super_MLLinOp.m_grids.
                         super_vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                         .
                         super__Vector_base<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[lVar16].
                         super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                         super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>;
      lVar14 = *(long *)&(this->super_MLCellABecLap).super_MLCellLinOp.super_MLLinOp.m_dmap.
                         super_vector<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
                         .
                         super__Vector_base<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[lVar16].
                         super_vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                         .
                         super__Vector_base<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
      ;
      local_1b8._1_7_ = 0;
      local_1b8[0] = true;
      local_1a8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_1a8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_1b8._8_4_ = 0;
      local_1b8._12_4_ = 0;
      local_1a8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      pFVar3 = *(FabFactory<amrex::FArrayBox> **)
                (*(long *)&(this->super_MLCellABecLap).super_MLCellLinOp.super_MLLinOp.m_factory.
                           super_vector<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
                           .
                           super__Vector_base<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[lVar16].
                           super_vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>
                           .
                           super__Vector_base<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>
                + lVar19 * 8);
      this_00 = (MultiFab *)operator_new(0x180);
      MultiFab::MultiFab(this_00,(BoxArray *)(lVar17 + lVar13),
                         (DistributionMapping *)(lVar14 + local_250),ncomp,0,(MFInfo *)local_1b8,
                         pFVar3);
      this = local_1c8;
      lVar17 = local_1d0;
      lVar14 = *(long *)&(local_1c8->m_eb_b_coeffs).
                         super_vector<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
                         .
                         super__Vector_base<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[lVar16].
                         super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                         .
                         super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
      ;
      plVar6 = *(long **)(lVar14 + lVar19 * 8);
      *(MultiFab **)(lVar14 + lVar19 * 8) = this_00;
      if (plVar6 != (long *)0x0) {
        (**(code **)(*plVar6 + 8))();
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_1a8);
      lVar19 = lVar19 + 1;
      lVar13 = lVar13 + 0x68;
      local_250 = local_250 + 0x10;
    } while (lVar19 < (this->super_MLCellABecLap).super_MLCellLinOp.super_MLLinOp.m_num_mg_levels.
                      super_vector<int,_std::allocator<int>_>.
                      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                      _M_start[lVar17]);
  }
  lVar13 = **(long **)&(this->super_MLCellABecLap).super_MLCellLinOp.super_MLLinOp.m_factory.
                       super_vector<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
                       .
                       super__Vector_base<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[lVar16].
                       super_vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>
                       .
                       super__Vector_base<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>
  ;
  if (lVar13 == 0) {
    lVar13 = 0;
  }
  else {
    lVar13 = __dynamic_cast(lVar13,&FabFactory<amrex::FArrayBox>::typeinfo,
                            &EBFArrayBoxFactory::typeinfo,0);
  }
  if (lVar13 == 0) {
    pFVar9 = (FabArray<amrex::EBCellFlagFab> *)0x0;
  }
  else {
    pFVar9 = EBDataCollection::getMultiEBCellFlagFab(*(EBDataCollection **)(lVar13 + 0xd8));
  }
  local_44.num_streams = Gpu::Device::max_gpu_streams;
  local_44.do_tiling = true;
  local_44.tilesize.vect[0] = (int)FabArrayBase::mfiter_tile_size;
  local_44.tilesize.vect[1] = FabArrayBase::mfiter_tile_size._4_4_;
  local_44.tilesize.vect[2] = DAT_00753ec0;
  local_44.dynamic = true;
  local_44.device_sync = true;
  MFIter::MFIter((MFIter *)local_1b8,&local_1d8->super_FabArrayBase,&local_44);
  if ((int)local_1a8.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage < local_190) {
    local_1c0 = (ulong)ncomp;
    local_150 = pFVar9;
    do {
      pFVar9 = local_150;
      MFIter::tilebox(&local_1f4,(MFIter *)local_1b8);
      FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (&local_108,
                 (FabArray<amrex::FArrayBox> *)
                 (this->m_eb_phi).
                 super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                 .
                 super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar17]._M_t.
                 super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,
                 (MFIter *)local_1b8);
      FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (&local_148,
                 (FabArray<amrex::FArrayBox> *)
                 **(undefined8 **)
                   &(this->m_eb_b_coeffs).
                    super_vector<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
                    .
                    super__Vector_base<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[lVar16].
                    super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                    .
                    super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                 ,(MFIter *)local_1b8);
      if (pFVar9 == (FabArray<amrex::EBCellFlagFab> *)0x0) {
LAB_0060b865:
        if (0 < (int)ncomp) {
          lVar17 = (long)local_1f4.smallend.vect[1];
          local_248 = 0;
          uVar11 = 0;
          do {
            iVar18 = local_1f4.smallend.vect[2];
            if (local_1f4.smallend.vect[2] <= local_1f4.bigend.vect[2]) {
              do {
                if (local_1f4.smallend.vect[1] <= local_1f4.bigend.vect[1]) {
                  lVar19 = (long)local_148.p +
                           local_148.nstride * local_248 +
                           (lVar17 - local_148.begin.y) * local_148.jstride * 8 +
                           ((long)iVar18 - (long)local_148.begin.z) * local_148.kstride * 8 +
                           (long)local_148.begin.x * -8 + (long)local_1f4.smallend.vect[0] * 8;
                  lVar14 = (long)local_108.p +
                           local_108.nstride * local_248 +
                           (lVar17 - local_108.begin.y) * local_108.jstride * 8 +
                           ((long)iVar18 - (long)local_108.begin.z) * local_108.kstride * 8 +
                           (long)local_108.begin.x * -8 + (long)local_1f4.smallend.vect[0] * 8;
                  lVar13 = lVar17;
                  do {
                    if (local_1f4.smallend.vect[0] <= local_1f4.bigend.vect[0]) {
                      lVar12 = 0;
                      do {
                        *(undefined8 *)(lVar14 + lVar12 * 8) = 0;
                        *(undefined8 *)(lVar19 + lVar12 * 8) = 0;
                        lVar12 = lVar12 + 1;
                      } while ((local_1f4.bigend.vect[0] - local_1f4.smallend.vect[0]) + 1 !=
                               (int)lVar12);
                    }
                    lVar13 = lVar13 + 1;
                    lVar19 = lVar19 + local_148.jstride * 8;
                    lVar14 = lVar14 + local_108.jstride * 8;
                  } while (local_1f4.bigend.vect[1] + 1 != (int)lVar13);
                }
                bVar20 = iVar18 != local_1f4.bigend.vect[2];
                iVar18 = iVar18 + 1;
              } while (bVar20);
            }
            uVar11 = uVar11 + 1;
            local_248 = local_248 + 8;
          } while (uVar11 != local_1c0);
        }
      }
      else {
        ppbVar10 = &local_1a8.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage;
        if (local_178 != (Vector<int,_std::allocator<int>_> *)0x0) {
          ppbVar10 = (pointer *)
                     ((local_178->super_vector<int,_std::allocator<int>_>).
                      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                      _M_start +
                     (int)local_1a8.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
        }
        FVar7 = EBCellFlagFab::getType
                          ((pFVar9->m_fabs_v).
                           super__Vector_base<amrex::EBCellFlagFab_*,_std::allocator<amrex::EBCellFlagFab_*>_>
                           ._M_impl.super__Vector_impl_data._M_start[*(int *)ppbVar10],&local_1f4);
        if ((uint)(FVar7 + singlevalued) < 2) goto LAB_0060b865;
        FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  (&local_c8,local_1d8,(MFIter *)local_1b8);
        FabArray<amrex::EBCellFlagFab>::const_array<amrex::EBCellFlagFab,_0>
                  (&local_88,pFVar9,(MFIter *)local_1b8);
        if (0 < (int)ncomp) {
          lVar17 = (long)local_1f4.smallend.vect[0];
          local_218 = 0;
          uVar11 = 0;
          do {
            iVar18 = local_1f4.smallend.vect[2];
            if (local_1f4.smallend.vect[2] <= local_1f4.bigend.vect[2]) {
              do {
                if (local_1f4.smallend.vect[1] <= local_1f4.bigend.vect[1]) {
                  lVar19 = (long)iVar18;
                  puVar15 = (uint32_t *)
                            ((long)&local_88.p
                                    [lVar17 + ((lVar19 - local_88.begin.z) * local_88.kstride -
                                              (long)local_88.begin.x)].flag +
                            ((long)local_1f4.smallend.vect[1] - (long)local_88.begin.y) *
                            local_88.jstride * 4);
                  lVar13 = (long)local_1f4.smallend.vect[1];
                  do {
                    if (local_1f4.smallend.vect[0] <= local_1f4.bigend.vect[0]) {
                      lVar12 = 0;
                      lVar14 = lVar17;
                      do {
                        uVar21 = 0;
                        uVar22 = 0;
                        uVar23 = 0;
                        uVar24 = 0;
                        if ((puVar15[lVar12] & 3) == 1) {
                          uVar1 = *(undefined8 *)
                                   ((long)local_c8.p +
                                   lVar12 * 8 +
                                   local_c8.nstride * local_218 +
                                   (lVar19 - local_c8.begin.z) * local_c8.kstride * 8 +
                                   (lVar13 - local_c8.begin.y) * local_c8.jstride * 8 +
                                   (long)local_c8.begin.x * -8 + lVar17 * 8);
                          uVar21 = (undefined4)uVar1;
                          uVar22 = (undefined4)((ulong)uVar1 >> 0x20);
                          uVar23 = SUB84(local_158,0);
                          uVar24 = (undefined4)((ulong)local_158 >> 0x20);
                        }
                        local_108.p
                        [(lVar13 - local_108.begin.y) * local_108.jstride +
                         (lVar19 - local_108.begin.z) * local_108.kstride +
                         local_108.nstride * uVar11 + (lVar14 - local_108.begin.x)] =
                             (double)CONCAT44(uVar22,uVar21);
                        local_148.p
                        [(lVar13 - local_148.begin.y) * local_148.jstride +
                         (lVar19 - local_148.begin.z) * local_148.kstride +
                         local_148.nstride * uVar11 + (lVar14 - local_148.begin.x)] =
                             (double)CONCAT44(uVar24,uVar23);
                        lVar14 = lVar14 + 1;
                        lVar12 = lVar12 + 1;
                      } while ((local_1f4.bigend.vect[0] - local_1f4.smallend.vect[0]) + 1 !=
                               (int)lVar12);
                    }
                    lVar13 = lVar13 + 1;
                    puVar15 = puVar15 + local_88.jstride;
                  } while (local_1f4.bigend.vect[1] + 1 != (int)lVar13);
                }
                bVar20 = iVar18 != local_1f4.bigend.vect[2];
                iVar18 = iVar18 + 1;
              } while (bVar20);
            }
            uVar11 = uVar11 + 1;
            local_218 = local_218 + 8;
          } while (uVar11 != local_1c0);
        }
      }
      MFIter::operator++((MFIter *)local_1b8);
      this = local_1c8;
      lVar17 = local_1d0;
    } while ((int)local_1a8.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage < local_190);
  }
  MFIter::~MFIter((MFIter *)local_1b8);
  if (LVar2 == CellCentroid) {
    _Var8.super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
    super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
    super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl =
         (this->m_eb_phi).
         super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
         .
         super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start[lVar17]._M_t.
         super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>;
    PVar25 = Geometry::periodicity
                       (*(Geometry **)
                         &(this->super_MLCellABecLap).super_MLCellLinOp.super_MLLinOp.m_geom.
                          super_vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                          .
                          super__Vector_base<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[lVar16].
                          super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                          super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>);
    local_1b8[0] = PVar25.period.vect[0]._0_1_;
    local_1b8._1_7_ = PVar25.period.vect._1_7_;
    local_1b8._8_4_ = PVar25.period.vect[2];
    FabArray<amrex::FArrayBox>::FillBoundary<double>
              ((FabArray<amrex::FArrayBox> *)
               _Var8.super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>.
               _M_t.super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
               .super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,
               (Periodicity *)local_1b8,false);
  }
  return;
}

Assistant:

void
MLEBABecLap::setEBDirichlet (int amrlev, const MultiFab& phi, Real beta)
{
    const int ncomp = getNComp();
    bool phi_on_centroid = (m_phi_loc == Location::CellCentroid);
    if (m_eb_phi[amrlev] == nullptr) {
        const int mglev = 0;
        const int ngrow = phi_on_centroid ? 1 : 0;
        m_eb_phi[amrlev] = std::make_unique<MultiFab>(m_grids[amrlev][mglev],
                                                      m_dmap[amrlev][mglev],
                                                      ncomp, ngrow, MFInfo(),
                                                      *m_factory[amrlev][mglev]);
    }
    if (m_eb_b_coeffs[amrlev][0] == nullptr) {
        for (int mglev = 0; mglev < m_num_mg_levels[amrlev]; ++mglev) {
            m_eb_b_coeffs[amrlev][mglev] = std::make_unique<MultiFab>(m_grids[amrlev][mglev],
                                                                      m_dmap[amrlev][mglev],
                                                                      ncomp, 0, MFInfo(),
                                                                      *m_factory[amrlev][mglev]);
        }
    }

    auto factory = dynamic_cast<EBFArrayBoxFactory const*>(m_factory[amrlev][0].get());
    const FabArray<EBCellFlagFab>* flags = (factory) ? &(factory->getMultiEBCellFlagFab()) : nullptr;

    MFItInfo mfi_info;
    if (Gpu::notInLaunchRegion()) mfi_info.EnableTiling().SetDynamic(true);
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(phi, mfi_info); mfi.isValid(); ++mfi)
    {
        const Box& bx = mfi.tilebox();
        Array4<Real> const& phiout = m_eb_phi[amrlev]->array(mfi);
        Array4<Real> const& betaout = m_eb_b_coeffs[amrlev][0]->array(mfi);
        FabType t = (flags) ? (*flags)[mfi].getType(bx) : FabType::regular;
        if (FabType::regular == t || FabType::covered == t) {
            AMREX_HOST_DEVICE_PARALLEL_FOR_4D ( bx, ncomp, i, j, k, n,
            {
                phiout(i,j,k,n) = 0.0;
                betaout(i,j,k,n) = 0.0;
            });
        } else {
            Array4<Real const> const& phiin = phi.const_array(mfi);
            const auto& flag = flags->const_array(mfi);
            AMREX_HOST_DEVICE_PARALLEL_FOR_4D ( bx, ncomp, i, j, k, n,
            {
                if (flag(i,j,k).isSingleValued()) {
                    phiout(i,j,k,n) = phiin(i,j,k,n);
                    betaout(i,j,k,n) = beta;
                } else {
                    phiout(i,j,k,n) = 0.0;
                    betaout(i,j,k,n) = 0.0;
                }
            });
        }
    }

    if (phi_on_centroid)
      m_eb_phi[amrlev]->FillBoundary(m_geom[amrlev][0].periodicity());
}